

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owner.cpp
# Opt level: O0

string * fs_get_owner_name_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  char *__s;
  string_view path_00;
  bool bVar1;
  uint *puVar2;
  string_view local_78;
  _Optional_payload_base<unsigned_int> local_68;
  char *local_60;
  allocator<char> local_41;
  passwd *local_40;
  passwd *pw;
  char *local_30;
  _Optional_payload_base<unsigned_int> local_28;
  optional<unsigned_int> uid;
  string_view path_local;
  
  pw = (passwd *)path._M_len;
  local_30 = path._M_str;
  uid.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)(_Optional_base<unsigned_int,_true,_true>)pw;
  local_28 = (_Optional_payload_base<unsigned_int>)fs_stat_uid(path);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_28);
  if (bVar1) {
    puVar2 = std::optional<unsigned_int>::value((optional<unsigned_int> *)&local_28);
    local_40 = getpwuid(*puVar2);
    if (local_40 != (passwd *)0x0) {
      __s = local_40->pw_name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,&local_41);
      std::allocator<char>::~allocator(&local_41);
      return __return_storage_ptr__;
    }
    local_40 = (passwd *)0x0;
  }
  local_68 = (_Optional_payload_base<unsigned_int>)
             uid.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>;
  local_60 = path._M_str;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_78,"fs_get_owner_name");
  path_00._M_str = local_60;
  path_00._M_len._0_4_ = local_68._M_payload;
  path_00._M_len._4_1_ = local_68._M_engaged;
  path_00._M_len._5_3_ = local_68._5_3_;
  fs_print_error(path_00,local_78);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string
fs_get_owner_name(std::string_view path)
{
#if defined(_WIN32)
  if (std::string s = fs_win32_owner(path, false); !s.empty())
    return s;
#else
  if (auto uid = fs_stat_uid(path)) {
    if (auto pw = getpwuid(uid.value()))
      return pw->pw_name;
  }
#endif

  fs_print_error(path, __func__);
  return {};
}